

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O3

void __thiscall
PGSStreamReader::setVideoInfo(PGSStreamReader *this,uint16_t width,uint16_t height,double fps)

{
  undefined6 in_register_00000012;
  ulong uVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  
  uVar2 = CONCAT62(in_register_00000032,width);
  uVar1 = CONCAT62(in_register_00000012,height);
  this->m_scaled_width = width;
  this->m_scaled_height = height;
  this->m_newFps = fps;
  if ((int)uVar1 != 0 && (int)uVar2 != 0) {
    text_subtitles::TextToPGSConverter::enlargeCrop
              (this->m_render,width,height,&this->m_scaled_width,&this->m_scaled_height);
    uVar2 = (ulong)this->m_scaled_width;
    uVar1 = (ulong)this->m_scaled_height;
    fps = this->m_newFps;
  }
  text_subtitles::TextToPGSConverter::setVideoInfo
            (this->m_render,(uint16_t)uVar2,(uint16_t)uVar1,fps);
  return;
}

Assistant:

void PGSStreamReader::setVideoInfo(const uint16_t width, const uint16_t height, const double fps)
{
    m_scaled_width = width;
    m_scaled_height = height;
    m_newFps = fps;
    if (width && height)
        m_render->enlargeCrop(width, height, &m_scaled_width, &m_scaled_height);
    m_render->setVideoInfo(m_scaled_width, m_scaled_height, m_newFps);
}